

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O0

void get_msurf_descriptor_precompute_gauss_case(integral_image *iimage,interest_point *ipoint)

{
  float *in_RSI;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  int i_1;
  float norm_factor;
  float d4;
  float d3;
  float d2;
  float d1;
  float gauss_s2;
  float rry;
  float rrx;
  float ry;
  float rx;
  float gauss_s1;
  float gauss_s1_x;
  int sample_x_sub_int_scale;
  int sample_x;
  int k;
  int gauss_index_k;
  float gauss_s1_y;
  int sample_y_sub_int_scale;
  int sample_y;
  int l;
  int gauss_index_l;
  float mdy;
  float mdx;
  float dy;
  float dx;
  int j;
  int i;
  float gauss_s1_c1_p4;
  float gauss_s1_c1_p3;
  float gauss_s1_c1_p2;
  float gauss_s1_c1_p1;
  float gauss_s1_c1_z0;
  float gauss_s1_c1_m1;
  float gauss_s1_c1_m2;
  float gauss_s1_c1_m3;
  float gauss_s1_c1_m4;
  float gauss_s1_c0_p4;
  float gauss_s1_c0_p3;
  float gauss_s1_c0_p2;
  float gauss_s1_c0_p1;
  float gauss_s1_c0_z0;
  float gauss_s1_c0_m1;
  float gauss_s1_c0_m2;
  float gauss_s1_c0_m3;
  float gauss_s1_c0_m4;
  float e_c1_p4;
  float e_c1_p3;
  float e_c1_p2;
  float e_c1_p1;
  float e_c1_m1;
  float e_c1_m2;
  float e_c1_m3;
  float e_c1_m4;
  float e_c0_p4;
  float e_c0_p3;
  float e_c0_p2;
  float e_c0_p1;
  float e_c0_m1;
  float e_c0_m2;
  float e_c0_m3;
  float e_c0_m4;
  float s11;
  float s10;
  float s9;
  float s8;
  float s7;
  float s6;
  float s5;
  float s4;
  float s3;
  float s2;
  float s1;
  float s0;
  int gauss_s2_index;
  float sum_of_squares;
  int desc_idx;
  float *descriptor;
  float ipoint_y;
  float ipoint_x;
  float g1_factor;
  float scale_squared;
  int int_scale;
  float scale;
  int local_164;
  undefined4 in_stack_fffffffffffffea0;
  float in_stack_fffffffffffffea4;
  float in_stack_fffffffffffffea8;
  float in_stack_fffffffffffffeac;
  float in_stack_fffffffffffffeb4;
  float in_stack_fffffffffffffeb8;
  float in_stack_fffffffffffffebc;
  float fVar74;
  float local_134;
  int local_128;
  int local_124;
  float local_120;
  int local_114;
  int local_110;
  float local_10c;
  float local_108;
  float local_104;
  float local_100;
  int local_fc;
  int local_f8;
  int local_3c;
  float local_38;
  int local_34;
  
  fVar28 = in_RSI[2];
  auVar57._8_4_ = 0x80000000;
  auVar57._0_8_ = 0x8000000080000000;
  auVar57._12_4_ = 0x80000000;
  auVar34._8_4_ = 0x3effffff;
  auVar34._0_8_ = 0x3effffff3effffff;
  auVar34._12_4_ = 0x3effffff;
  auVar1 = vpternlogd_avx512vl(auVar34,ZEXT416((uint)fVar28),auVar57,0xf8);
  vroundss_avx(ZEXT416((uint)fVar28),ZEXT416((uint)(fVar28 + auVar1._0_4_)),0xb);
  fVar11 = -0.08 / (fVar28 * fVar28);
  fVar12 = *in_RSI;
  auVar58._8_4_ = 0x80000000;
  auVar58._0_8_ = 0x8000000080000000;
  auVar58._12_4_ = 0x80000000;
  auVar35._8_4_ = 0x3effffff;
  auVar35._0_8_ = 0x3effffff3effffff;
  auVar35._12_4_ = 0x3effffff;
  auVar1 = vpternlogd_avx512vl(auVar35,ZEXT416((uint)fVar12),auVar58,0xf8);
  auVar1 = vroundss_avx(ZEXT416((uint)fVar12),ZEXT416((uint)(fVar12 + auVar1._0_4_)),0xb);
  auVar55._0_8_ = (double)auVar1._0_4_;
  auVar55._8_8_ = 0;
  auVar1._0_8_ = (double)fVar28;
  auVar1._8_8_ = 0;
  auVar34 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar1,auVar55);
  fVar12 = in_RSI[1];
  auVar59._8_4_ = 0x80000000;
  auVar59._0_8_ = 0x8000000080000000;
  auVar59._12_4_ = 0x80000000;
  auVar36._8_4_ = 0x3effffff;
  auVar36._0_8_ = 0x3effffff3effffff;
  auVar36._12_4_ = 0x3effffff;
  auVar1 = vpternlogd_avx512vl(auVar36,ZEXT416((uint)fVar12),auVar59,0xf8);
  auVar1 = vroundss_avx(ZEXT416((uint)fVar12),ZEXT416((uint)(fVar12 + auVar1._0_4_)),0xb);
  auVar56._0_8_ = (double)auVar1._0_4_;
  auVar56._8_8_ = 0;
  auVar2._0_8_ = (double)fVar28;
  auVar2._8_8_ = 0;
  auVar35 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar2,auVar56);
  local_34 = 0;
  local_38 = 0.0;
  local_3c = 0;
  auVar3._4_12_ = SUB1612(ZEXT816(0x3fe0000000000000),4);
  auVar3._0_4_ = fVar28 * 0.5;
  auVar60._8_4_ = 0x80000000;
  auVar60._0_8_ = 0x8000000080000000;
  auVar60._12_4_ = 0x80000000;
  auVar37._8_4_ = 0x3effffff;
  auVar37._0_8_ = 0x3effffff3effffff;
  auVar37._12_4_ = 0x3effffff;
  auVar1 = vpternlogd_avx512vl(auVar37,auVar3,auVar60,0xf8);
  auVar1 = vroundss_avx(auVar3,ZEXT416((uint)(fVar28 * 0.5 + auVar1._0_4_)),0xb);
  auVar4._4_12_ = SUB1612(ZEXT816(0x3ff8000000000000),4);
  auVar4._0_4_ = fVar28 * 1.5;
  auVar61._8_4_ = 0x80000000;
  auVar61._0_8_ = 0x8000000080000000;
  auVar61._12_4_ = 0x80000000;
  auVar38._8_4_ = 0x3effffff;
  auVar38._0_8_ = 0x3effffff3effffff;
  auVar38._12_4_ = 0x3effffff;
  auVar2 = vpternlogd_avx512vl(auVar38,auVar4,auVar61,0xf8);
  auVar2 = vroundss_avx(auVar4,ZEXT416((uint)(fVar28 * 1.5 + auVar2._0_4_)),0xb);
  auVar5._4_12_ = SUB1612(ZEXT816(0x4004000000000000),4);
  auVar5._0_4_ = fVar28 * 2.5;
  auVar62._8_4_ = 0x80000000;
  auVar62._0_8_ = 0x8000000080000000;
  auVar62._12_4_ = 0x80000000;
  auVar39._8_4_ = 0x3effffff;
  auVar39._0_8_ = 0x3effffff3effffff;
  auVar39._12_4_ = 0x3effffff;
  auVar3 = vpternlogd_avx512vl(auVar39,auVar5,auVar62,0xf8);
  auVar3 = vroundss_avx(auVar5,ZEXT416((uint)(fVar28 * 2.5 + auVar3._0_4_)),0xb);
  fVar19 = auVar3._0_4_;
  auVar6._4_12_ = SUB1612(ZEXT816(0x400c000000000000),4);
  auVar6._0_4_ = fVar28 * 3.5;
  auVar63._8_4_ = 0x80000000;
  auVar63._0_8_ = 0x8000000080000000;
  auVar63._12_4_ = 0x80000000;
  auVar40._8_4_ = 0x3effffff;
  auVar40._0_8_ = 0x3effffff3effffff;
  auVar40._12_4_ = 0x3effffff;
  auVar3 = vpternlogd_avx512vl(auVar40,auVar6,auVar63,0xf8);
  auVar3 = vroundss_avx(auVar6,ZEXT416((uint)(fVar28 * 3.5 + auVar3._0_4_)),0xb);
  auVar7._4_12_ = SUB1612(ZEXT816(0x4012000000000000),4);
  auVar7._0_4_ = fVar28 * 4.5;
  auVar64._8_4_ = 0x80000000;
  auVar64._0_8_ = 0x8000000080000000;
  auVar64._12_4_ = 0x80000000;
  auVar41._8_4_ = 0x3effffff;
  auVar41._0_8_ = 0x3effffff3effffff;
  auVar41._12_4_ = 0x3effffff;
  auVar4 = vpternlogd_avx512vl(auVar41,auVar7,auVar64,0xf8);
  auVar4 = vroundss_avx(auVar7,ZEXT416((uint)(fVar28 * 4.5 + auVar4._0_4_)),0xb);
  auVar8._4_12_ = SUB1612(ZEXT816(0x4016000000000000),4);
  auVar8._0_4_ = fVar28 * 5.5;
  auVar65._8_4_ = 0x80000000;
  auVar65._0_8_ = 0x8000000080000000;
  auVar65._12_4_ = 0x80000000;
  auVar42._8_4_ = 0x3effffff;
  auVar42._0_8_ = 0x3effffff3effffff;
  auVar42._12_4_ = 0x3effffff;
  auVar5 = vpternlogd_avx512vl(auVar42,auVar8,auVar65,0xf8);
  auVar5 = vroundss_avx(auVar8,ZEXT416((uint)(fVar28 * 5.5 + auVar5._0_4_)),0xb);
  auVar9._4_12_ = SUB1612(ZEXT816(0x401a000000000000),4);
  auVar9._0_4_ = fVar28 * 6.5;
  auVar66._8_4_ = 0x80000000;
  auVar66._0_8_ = 0x8000000080000000;
  auVar66._12_4_ = 0x80000000;
  auVar43._8_4_ = 0x3effffff;
  auVar43._0_8_ = 0x3effffff3effffff;
  auVar43._12_4_ = 0x3effffff;
  auVar6 = vpternlogd_avx512vl(auVar43,auVar9,auVar66,0xf8);
  auVar6 = vroundss_avx(auVar9,ZEXT416((uint)(fVar28 * 6.5 + auVar6._0_4_)),0xb);
  auVar10._4_12_ = SUB1612(ZEXT816(0x401e000000000000),4);
  auVar10._0_4_ = fVar28 * 7.5;
  auVar67._8_4_ = 0x80000000;
  auVar67._0_8_ = 0x8000000080000000;
  auVar67._12_4_ = 0x80000000;
  auVar44._8_4_ = 0x3effffff;
  auVar44._0_8_ = 0x3effffff3effffff;
  auVar44._12_4_ = 0x3effffff;
  auVar7 = vpternlogd_avx512vl(auVar44,auVar10,auVar67,0xf8);
  auVar7 = vroundss_avx(auVar10,ZEXT416((uint)(fVar28 * 7.5 + auVar7._0_4_)),0xb);
  fVar27 = auVar7._0_4_;
  auVar29._4_12_ = SUB1612(ZEXT816(0x4021000000000000),4);
  auVar29._0_4_ = fVar28 * 8.5;
  auVar68._8_4_ = 0x80000000;
  auVar68._0_8_ = 0x8000000080000000;
  auVar68._12_4_ = 0x80000000;
  auVar45._8_4_ = 0x3effffff;
  auVar45._0_8_ = 0x3effffff3effffff;
  auVar45._12_4_ = 0x3effffff;
  auVar7 = vpternlogd_avx512vl(auVar45,auVar29,auVar68,0xf8);
  auVar7 = vroundss_avx(auVar29,ZEXT416((uint)(fVar28 * 8.5 + auVar7._0_4_)),0xb);
  auVar30._4_12_ = SUB1612(ZEXT816(0x4023000000000000),4);
  auVar30._0_4_ = fVar28 * 9.5;
  auVar69._8_4_ = 0x80000000;
  auVar69._0_8_ = 0x8000000080000000;
  auVar69._12_4_ = 0x80000000;
  auVar46._8_4_ = 0x3effffff;
  auVar46._0_8_ = 0x3effffff3effffff;
  auVar46._12_4_ = 0x3effffff;
  auVar8 = vpternlogd_avx512vl(auVar46,auVar30,auVar69,0xf8);
  auVar8 = vroundss_avx(auVar30,ZEXT416((uint)(fVar28 * 9.5 + auVar8._0_4_)),0xb);
  auVar31._4_12_ = SUB1612(ZEXT816(0x4025000000000000),4);
  auVar31._0_4_ = fVar28 * 10.5;
  auVar70._8_4_ = 0x80000000;
  auVar70._0_8_ = 0x8000000080000000;
  auVar70._12_4_ = 0x80000000;
  auVar47._8_4_ = 0x3effffff;
  auVar47._0_8_ = 0x3effffff3effffff;
  auVar47._12_4_ = 0x3effffff;
  auVar9 = vpternlogd_avx512vl(auVar47,auVar31,auVar70,0xf8);
  auVar9 = vroundss_avx(auVar31,ZEXT416((uint)(fVar28 * 10.5 + auVar9._0_4_)),0xb);
  auVar32._4_12_ = SUB1612(ZEXT816(0x4027000000000000),4);
  auVar32._0_4_ = fVar28 * 11.5;
  auVar71._8_4_ = 0x80000000;
  auVar71._0_8_ = 0x8000000080000000;
  auVar71._12_4_ = 0x80000000;
  auVar48._8_4_ = 0x3effffff;
  auVar48._0_8_ = 0x3effffff3effffff;
  auVar48._12_4_ = 0x3effffff;
  auVar10 = vpternlogd_avx512vl(auVar48,auVar32,auVar71,0xf8);
  auVar10 = vroundss_avx(auVar32,ZEXT416((uint)(fVar28 * 11.5 + auVar10._0_4_)),0xb);
  fVar12 = fVar19 + auVar2._0_4_;
  fVar13 = fVar19 + auVar1._0_4_;
  fVar14 = fVar19 - auVar1._0_4_;
  fVar15 = fVar19 - auVar2._0_4_;
  fVar16 = fVar19 - auVar3._0_4_;
  fVar17 = fVar19 - auVar4._0_4_;
  fVar18 = fVar19 - auVar5._0_4_;
  fVar19 = fVar19 - auVar6._0_4_;
  fVar20 = fVar27 - auVar3._0_4_;
  fVar21 = fVar27 - auVar4._0_4_;
  fVar22 = fVar27 - auVar5._0_4_;
  fVar23 = fVar27 - auVar6._0_4_;
  fVar24 = fVar27 - auVar7._0_4_;
  fVar25 = fVar27 - auVar8._0_4_;
  fVar26 = fVar27 - auVar9._0_4_;
  fVar27 = fVar27 - auVar10._0_4_;
  fVar12 = expf(fVar11 * fVar12 * fVar12);
  fVar13 = expf(fVar11 * fVar13 * fVar13);
  fVar14 = expf(fVar11 * fVar14 * fVar14);
  fVar15 = expf(fVar11 * fVar15 * fVar15);
  fVar16 = expf(fVar11 * fVar16 * fVar16);
  fVar17 = expf(fVar11 * fVar17 * fVar17);
  fVar18 = expf(fVar11 * fVar18 * fVar18);
  fVar19 = expf(fVar11 * fVar19 * fVar19);
  fVar20 = expf(fVar11 * fVar20 * fVar20);
  fVar21 = expf(fVar11 * fVar21 * fVar21);
  fVar22 = expf(fVar11 * fVar22 * fVar22);
  fVar23 = expf(fVar11 * fVar23 * fVar23);
  fVar24 = expf(fVar11 * fVar24 * fVar24);
  fVar25 = expf(fVar11 * fVar25 * fVar25);
  fVar26 = expf(fVar11 * fVar26 * fVar26);
  fVar27 = expf(fVar11 * fVar27 * fVar27);
  for (local_f8 = -8; local_f8 < 8; local_f8 = local_f8 + 5) {
    for (local_fc = -8; local_fc < 8; local_fc = local_fc + 5) {
      local_100 = 0.0;
      local_104 = 0.0;
      local_108 = 0.0;
      auVar33 = ZEXT1664((undefined1  [16])0x0);
      local_10c = 0.0;
      local_110 = -4;
      for (local_114 = local_fc + -4; local_114 < local_fc + 5; local_114 = local_114 + 1) {
        auVar49._0_4_ = (float)local_114;
        auVar49._4_12_ = auVar33._4_12_;
        auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar28),auVar49,ZEXT416((uint)(float)auVar35._0_8_));
        auVar72._8_4_ = 0x80000000;
        auVar72._0_8_ = 0x8000000080000000;
        auVar72._12_4_ = 0x80000000;
        auVar50._8_4_ = 0x3effffff;
        auVar50._0_8_ = 0x3effffff3effffff;
        auVar50._12_4_ = 0x3effffff;
        auVar2 = vpternlogd_avx512vl(auVar50,auVar1,auVar72,0xf8);
        vroundss_avx(auVar1,ZEXT416((uint)(auVar1._0_4_ + auVar2._0_4_)),0xb);
        auVar33 = ZEXT464(0xbf800000);
        local_120 = -1.0;
        if (local_fc == -8) {
          switch(local_110) {
          case 0:
            auVar33 = ZEXT464(0x3f800000);
            local_120 = 1.0;
            break;
          case 1:
            auVar33 = ZEXT464((uint)fVar23);
            local_120 = fVar23;
            break;
          case 2:
            auVar33 = ZEXT464((uint)fVar22);
            local_120 = fVar22;
            break;
          case 3:
            auVar33 = ZEXT464((uint)fVar21);
            local_120 = fVar21;
            break;
          case 4:
            auVar33 = ZEXT464((uint)fVar20);
            local_120 = fVar20;
            break;
          case -4:
            auVar33 = ZEXT464((uint)fVar27);
            local_120 = fVar27;
            break;
          case -3:
            auVar33 = ZEXT464((uint)fVar26);
            local_120 = fVar26;
            break;
          case -2:
            auVar33 = ZEXT464((uint)fVar25);
            local_120 = fVar25;
            break;
          case -1:
            auVar33 = ZEXT464((uint)fVar24);
            local_120 = fVar24;
          }
        }
        else if (local_fc == -3) {
          switch(local_110) {
          case 0:
            auVar33 = ZEXT464(0x3f800000);
            local_120 = 1.0;
            break;
          case 1:
            auVar33 = ZEXT464((uint)fVar15);
            local_120 = fVar15;
            break;
          case 2:
            auVar33 = ZEXT464((uint)fVar14);
            local_120 = fVar14;
            break;
          case 3:
            auVar33 = ZEXT464((uint)fVar13);
            local_120 = fVar13;
            break;
          case 4:
            auVar33 = ZEXT464((uint)fVar12);
            local_120 = fVar12;
            break;
          case -4:
            auVar33 = ZEXT464((uint)fVar19);
            local_120 = fVar19;
            break;
          case -3:
            auVar33 = ZEXT464((uint)fVar18);
            local_120 = fVar18;
            break;
          case -2:
            auVar33 = ZEXT464((uint)fVar17);
            local_120 = fVar17;
            break;
          case -1:
            auVar33 = ZEXT464((uint)fVar16);
            local_120 = fVar16;
          }
        }
        else if (local_fc == 2) {
          switch(local_110) {
          case 0:
            auVar33 = ZEXT464(0x3f800000);
            local_120 = 1.0;
            break;
          case 1:
            auVar33 = ZEXT464((uint)fVar16);
            local_120 = fVar16;
            break;
          case 2:
            auVar33 = ZEXT464((uint)fVar17);
            local_120 = fVar17;
            break;
          case 3:
            auVar33 = ZEXT464((uint)fVar18);
            local_120 = fVar18;
            break;
          case 4:
            auVar33 = ZEXT464((uint)fVar19);
            local_120 = fVar19;
            break;
          case -4:
            auVar33 = ZEXT464((uint)fVar12);
            local_120 = fVar12;
            break;
          case -3:
            auVar33 = ZEXT464((uint)fVar13);
            local_120 = fVar13;
            break;
          case -2:
            auVar33 = ZEXT464((uint)fVar14);
            local_120 = fVar14;
            break;
          case -1:
            auVar33 = ZEXT464((uint)fVar15);
            local_120 = fVar15;
          }
        }
        else if (local_fc == 7) {
          switch(local_110) {
          case 0:
            auVar33 = ZEXT464(0x3f800000);
            local_120 = 1.0;
            break;
          case 1:
            auVar33 = ZEXT464((uint)fVar24);
            local_120 = fVar24;
            break;
          case 2:
            auVar33 = ZEXT464((uint)fVar25);
            local_120 = fVar25;
            break;
          case 3:
            auVar33 = ZEXT464((uint)fVar26);
            local_120 = fVar26;
            break;
          case 4:
            auVar33 = ZEXT464((uint)fVar27);
            local_120 = fVar27;
            break;
          case -4:
            auVar33 = ZEXT464((uint)fVar20);
            local_120 = fVar20;
            break;
          case -3:
            auVar33 = ZEXT464((uint)fVar21);
            local_120 = fVar21;
            break;
          case -2:
            auVar33 = ZEXT464((uint)fVar22);
            local_120 = fVar22;
            break;
          case -1:
            auVar33 = ZEXT464((uint)fVar23);
            local_120 = fVar23;
          }
        }
        local_124 = -4;
        for (local_128 = local_f8 + -4; local_128 < local_f8 + 5; local_128 = local_128 + 1) {
          auVar51._0_4_ = (float)local_128;
          auVar51._4_12_ = auVar33._4_12_;
          auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar28),auVar51,ZEXT416((uint)(float)auVar34._0_8_)
                                  );
          auVar73._8_4_ = 0x80000000;
          auVar73._0_8_ = 0x8000000080000000;
          auVar73._12_4_ = 0x80000000;
          auVar52._8_4_ = 0x3effffff;
          auVar52._0_8_ = 0x3effffff3effffff;
          auVar52._12_4_ = 0x3effffff;
          auVar2 = vpternlogd_avx512vl(auVar52,auVar1,auVar73,0xf8);
          vroundss_avx(auVar1,ZEXT416((uint)(auVar1._0_4_ + auVar2._0_4_)),0xb);
          local_134 = -1.0;
          if (local_f8 == -8) {
            switch(local_124) {
            case 0:
              local_134 = 1.0;
              break;
            case 1:
              local_134 = fVar23;
              break;
            case 2:
              local_134 = fVar22;
              break;
            case 3:
              local_134 = fVar21;
              break;
            case 4:
              local_134 = fVar20;
              break;
            case -4:
              local_134 = fVar27;
              break;
            case -3:
              local_134 = fVar26;
              break;
            case -2:
              local_134 = fVar25;
              break;
            case -1:
              local_134 = fVar24;
            }
          }
          else if (local_f8 == -3) {
            switch(local_124) {
            case 0:
              local_134 = 1.0;
              break;
            case 1:
              local_134 = fVar15;
              break;
            case 2:
              local_134 = fVar14;
              break;
            case 3:
              local_134 = fVar13;
              break;
            case 4:
              local_134 = fVar12;
              break;
            case -4:
              local_134 = fVar19;
              break;
            case -3:
              local_134 = fVar18;
              break;
            case -2:
              local_134 = fVar17;
              break;
            case -1:
              local_134 = fVar16;
            }
          }
          else if (local_f8 == 2) {
            switch(local_124) {
            case 0:
              local_134 = 1.0;
              break;
            case 1:
              local_134 = fVar16;
              break;
            case 2:
              local_134 = fVar17;
              break;
            case 3:
              local_134 = fVar18;
              break;
            case 4:
              local_134 = fVar19;
              break;
            case -4:
              local_134 = fVar12;
              break;
            case -3:
              local_134 = fVar13;
              break;
            case -2:
              local_134 = fVar14;
              break;
            case -1:
              local_134 = fVar15;
            }
          }
          else if (local_f8 == 7) {
            switch(local_124) {
            case 0:
              local_134 = 1.0;
              break;
            case 1:
              local_134 = fVar24;
              break;
            case 2:
              local_134 = fVar25;
              break;
            case 3:
              local_134 = fVar26;
              break;
            case 4:
              local_134 = fVar27;
              break;
            case -4:
              local_134 = fVar20;
              break;
            case -3:
              local_134 = fVar21;
              break;
            case -2:
              local_134 = fVar22;
              break;
            case -1:
              local_134 = fVar23;
            }
          }
          fVar74 = 0.0;
          fVar11 = 0.0;
          haarXY_precheck_boundaries
                    ((integral_image *)0x0,(int)in_stack_fffffffffffffebc,
                     (int)in_stack_fffffffffffffeb8,(int)in_stack_fffffffffffffeb4,
                     (float *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                     (float *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
          in_stack_fffffffffffffebc = local_134 * local_120 * fVar11;
          in_stack_fffffffffffffeb8 = local_134 * local_120 * fVar74;
          local_100 = in_stack_fffffffffffffebc + local_100;
          local_104 = in_stack_fffffffffffffeb8 + local_104;
          auVar53._8_4_ = 0x7fffffff;
          auVar53._0_8_ = 0x7fffffff7fffffff;
          auVar53._12_4_ = 0x7fffffff;
          auVar1 = vpand_avx(ZEXT416((uint)in_stack_fffffffffffffebc),auVar53);
          local_108 = auVar1._0_4_ + local_108;
          auVar54._8_4_ = 0x7fffffff;
          auVar54._0_8_ = 0x7fffffff7fffffff;
          auVar54._12_4_ = 0x7fffffff;
          auVar1 = vpand_avx(ZEXT416((uint)in_stack_fffffffffffffeb8),auVar54);
          local_10c = auVar1._0_4_ + local_10c;
          auVar33 = ZEXT464((uint)local_10c);
          local_124 = local_124 + 1;
        }
        local_110 = local_110 + 1;
      }
      switch(local_3c) {
      case 0:
        in_stack_fffffffffffffeb4 = 0.026022;
        break;
      case 1:
        in_stack_fffffffffffffeb4 = 0.040585;
        break;
      case 2:
        in_stack_fffffffffffffeb4 = 0.040585;
        break;
      case 3:
        in_stack_fffffffffffffeb4 = 0.026022;
        break;
      case 4:
        in_stack_fffffffffffffeb4 = 0.040585;
        break;
      case 5:
        in_stack_fffffffffffffeb4 = 0.063297;
        break;
      case 6:
        in_stack_fffffffffffffeb4 = 0.063297;
        break;
      case 7:
        in_stack_fffffffffffffeb4 = 0.040585;
        break;
      case 8:
        in_stack_fffffffffffffeb4 = 0.040585;
        break;
      case 9:
        in_stack_fffffffffffffeb4 = 0.063297;
        break;
      case 10:
        in_stack_fffffffffffffeb4 = 0.063297;
        break;
      case 0xb:
        in_stack_fffffffffffffeb4 = 0.040585;
        break;
      case 0xc:
        in_stack_fffffffffffffeb4 = 0.026022;
        break;
      case 0xd:
        in_stack_fffffffffffffeb4 = 0.040585;
        break;
      case 0xe:
        in_stack_fffffffffffffeb4 = 0.040585;
        break;
      case 0xf:
        in_stack_fffffffffffffeb4 = 0.026022;
      }
      local_3c = local_3c + 1;
      local_100 = local_100 * in_stack_fffffffffffffeb4;
      in_stack_fffffffffffffeac = local_104 * in_stack_fffffffffffffeb4;
      in_stack_fffffffffffffea8 = local_108 * in_stack_fffffffffffffeb4;
      in_stack_fffffffffffffea4 = local_10c * in_stack_fffffffffffffeb4;
      in_RSI[(long)local_34 + 5] = local_100;
      in_RSI[(long)(local_34 + 1) + 5] = in_stack_fffffffffffffeac;
      in_RSI[(long)(local_34 + 2) + 5] = in_stack_fffffffffffffea8;
      in_RSI[(long)(local_34 + 3) + 5] = in_stack_fffffffffffffea4;
      auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_100),ZEXT416((uint)local_100),
                               ZEXT416((uint)(in_stack_fffffffffffffeac * in_stack_fffffffffffffeac)
                                      ));
      auVar1 = vfmadd213ss_fma(ZEXT416((uint)in_stack_fffffffffffffea8),
                               ZEXT416((uint)in_stack_fffffffffffffea8),auVar1);
      auVar1 = vfmadd213ss_fma(ZEXT416((uint)in_stack_fffffffffffffea4),
                               ZEXT416((uint)in_stack_fffffffffffffea4),auVar1);
      local_38 = auVar1._0_4_ + local_38;
      local_34 = local_34 + 4;
    }
  }
  fVar28 = sqrtf(local_38);
  for (local_164 = 0; local_164 < 0x40; local_164 = local_164 + 1) {
    in_RSI[(long)local_164 + 5] = (1.0 / fVar28) * in_RSI[(long)local_164 + 5];
  }
  return;
}

Assistant:

void get_msurf_descriptor_precompute_gauss_case(struct integral_image* iimage, struct interest_point* ipoint) {
    /*
    applied optimizations:
        - all of get_msurf_inlinedHaarWavelets
        - precompute gauss_s2 like get_msurf_descriptor_gauss_s2_precomputed 
          (changed to use case statements here)
        - precompute gauss_s1 by computing them once 
          with separable kernels and using case statements
    */

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale = (int) roundf(scale);
    // int int_scale_mul_2 =  2 * int_scale;
    float scale_squared = scale*scale;

    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    //float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    //r(2.5*s) + r(1.5*s) == -(r(2.5*s) - r(6.5*s))

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    float gauss_s1_c0_m4 = expf(g1_factor * (e_c0_m4 * e_c0_m4));
    float gauss_s1_c0_m3 = expf(g1_factor * (e_c0_m3 * e_c0_m3));
    float gauss_s1_c0_m2 = expf(g1_factor * (e_c0_m2 * e_c0_m2));
    float gauss_s1_c0_m1 = expf(g1_factor * (e_c0_m1 * e_c0_m1));
    float gauss_s1_c0_z0 = 1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    float gauss_s1_c0_p1 = expf(g1_factor * (e_c0_p1 * e_c0_p1));
    float gauss_s1_c0_p2 = expf(g1_factor * (e_c0_p2 * e_c0_p2));
    float gauss_s1_c0_p3 = expf(g1_factor * (e_c0_p3 * e_c0_p3));
    float gauss_s1_c0_p4 = expf(g1_factor * (e_c0_p4 * e_c0_p4));

    float gauss_s1_c1_m4 = expf(g1_factor * (e_c1_m4 * e_c1_m4));
    float gauss_s1_c1_m3 = expf(g1_factor * (e_c1_m3 * e_c1_m3));
    float gauss_s1_c1_m2 = expf(g1_factor * (e_c1_m2 * e_c1_m2));
    float gauss_s1_c1_m1 = expf(g1_factor * (e_c1_m1 * e_c1_m1));
    float gauss_s1_c1_z0 = 1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    float gauss_s1_c1_p1 = expf(g1_factor * (e_c1_p1 * e_c1_p1));
    float gauss_s1_c1_p2 = expf(g1_factor * (e_c1_p2 * e_c1_p2));
    float gauss_s1_c1_p3 = expf(g1_factor * (e_c1_p3 * e_c1_p3));
    float gauss_s1_c1_p4 = expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        for (int j=-8; j<8; j+=5) {

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            //int xs = (int) roundf(ipoint_x + (i+0.5f) * scale);
            //int ys = (int) roundf(ipoint_y + (j+0.5f) * scale);

            int gauss_index_l = -4;
            for (int l = j-4; l < j + 5; ++l, ++gauss_index_l) {

                //Get y coords of sample point
                int sample_y = (int) roundf(ipoint_y + l * scale);
                //float ys_sub_sample_y = (float) ys-sample_y;
                //float ys_sub_sample_y_squared = ys_sub_sample_y*ys_sub_sample_y;

                //Get y coords of sample point
                int sample_y_sub_int_scale = sample_y-int_scale;

                float gauss_s1_y = -1;
                if (j == -8) {
                    switch (gauss_index_l) {
                        case -4: gauss_s1_y = gauss_s1_c1_p4; break;
                        case -3: gauss_s1_y = gauss_s1_c1_p3; break;
                        case -2: gauss_s1_y = gauss_s1_c1_p2; break;
                        case -1: gauss_s1_y = gauss_s1_c1_p1; break;
                        case 0:  gauss_s1_y = gauss_s1_c1_z0; break;
                        case 1:  gauss_s1_y = gauss_s1_c1_m1; break;
                        case 2:  gauss_s1_y = gauss_s1_c1_m2; break;
                        case 3:  gauss_s1_y = gauss_s1_c1_m3; break;
                        case 4:  gauss_s1_y = gauss_s1_c1_m4; break;
                    };
                } else if (j == -3) {
                    switch (gauss_index_l) {
                        case -4: gauss_s1_y = gauss_s1_c0_p4; break;
                        case -3: gauss_s1_y = gauss_s1_c0_p3; break;
                        case -2: gauss_s1_y = gauss_s1_c0_p2; break;
                        case -1: gauss_s1_y = gauss_s1_c0_p1; break;
                        case 0:  gauss_s1_y = gauss_s1_c0_z0; break;
                        case 1:  gauss_s1_y = gauss_s1_c0_m1; break;
                        case 2:  gauss_s1_y = gauss_s1_c0_m2; break;
                        case 3:  gauss_s1_y = gauss_s1_c0_m3; break;
                        case 4:  gauss_s1_y = gauss_s1_c0_m4; break;
                    };
                } else if (j == 2) {
                    switch (gauss_index_l) {
                        case -4: gauss_s1_y = gauss_s1_c0_m4; break;
                        case -3: gauss_s1_y = gauss_s1_c0_m3; break;
                        case -2: gauss_s1_y = gauss_s1_c0_m2; break;
                        case -1: gauss_s1_y = gauss_s1_c0_m1; break;
                        case 0:  gauss_s1_y = gauss_s1_c0_z0; break;
                        case 1:  gauss_s1_y = gauss_s1_c0_p1; break;
                        case 2:  gauss_s1_y = gauss_s1_c0_p2; break;
                        case 3:  gauss_s1_y = gauss_s1_c0_p3; break;
                        case 4:  gauss_s1_y = gauss_s1_c0_p4; break;
                    };
                } else if (j == 7) {
                    switch (gauss_index_l) {
                        case -4: gauss_s1_y = gauss_s1_c1_m4; break;
                        case -3: gauss_s1_y = gauss_s1_c1_m3; break;
                        case -2: gauss_s1_y = gauss_s1_c1_m2; break;
                        case -1: gauss_s1_y = gauss_s1_c1_m1; break;
                        case 0:  gauss_s1_y = gauss_s1_c1_z0; break;
                        case 1:  gauss_s1_y = gauss_s1_c1_p1; break;
                        case 2:  gauss_s1_y = gauss_s1_c1_p2; break;
                        case 3:  gauss_s1_y = gauss_s1_c1_p3; break;
                        case 4:  gauss_s1_y = gauss_s1_c1_p4; break;
                    };
                }

                int gauss_index_k = -4;
                for (int k = i-4; k < i + 5; ++k, ++gauss_index_k) {
                
                    //Get x coords of sample point
                    int sample_x = (int) roundf(ipoint_x + k * scale);
                    //float xs_sub_sample_x = (float) xs-sample_x;
                    //float xs_sub_sample_x_squared = xs_sub_sample_x*xs_sub_sample_x;

                    //Get x coords of sample point
                    int sample_x_sub_int_scale = sample_x-int_scale;

                    float gauss_s1_x = -1;
                    if (i == -8) {
                        switch (gauss_index_k) {
                            case -4: gauss_s1_x = gauss_s1_c1_p4; break;
                            case -3: gauss_s1_x = gauss_s1_c1_p3; break;
                            case -2: gauss_s1_x = gauss_s1_c1_p2; break;
                            case -1: gauss_s1_x = gauss_s1_c1_p1; break;
                            case 0:  gauss_s1_x = gauss_s1_c1_z0; break;
                            case 1:  gauss_s1_x = gauss_s1_c1_m1; break;
                            case 2:  gauss_s1_x = gauss_s1_c1_m2; break;
                            case 3:  gauss_s1_x = gauss_s1_c1_m3; break;
                            case 4:  gauss_s1_x = gauss_s1_c1_m4; break;
                        };
                    } else if (i == -3) {
                        switch (gauss_index_k) {
                            case -4: gauss_s1_x = gauss_s1_c0_p4; break;
                            case -3: gauss_s1_x = gauss_s1_c0_p3; break;
                            case -2: gauss_s1_x = gauss_s1_c0_p2; break;
                            case -1: gauss_s1_x = gauss_s1_c0_p1; break;
                            case 0:  gauss_s1_x = gauss_s1_c0_z0; break;
                            case 1:  gauss_s1_x = gauss_s1_c0_m1; break;
                            case 2:  gauss_s1_x = gauss_s1_c0_m2; break;
                            case 3:  gauss_s1_x = gauss_s1_c0_m3; break;
                            case 4:  gauss_s1_x = gauss_s1_c0_m4; break;
                        };
                    } else if (i == 2) {
                        switch (gauss_index_k) {
                            case -4: gauss_s1_x = gauss_s1_c0_m4; break;
                            case -3: gauss_s1_x = gauss_s1_c0_m3; break;
                            case -2: gauss_s1_x = gauss_s1_c0_m2; break;
                            case -1: gauss_s1_x = gauss_s1_c0_m1; break;
                            case 0:  gauss_s1_x = gauss_s1_c0_z0; break;
                            case 1:  gauss_s1_x = gauss_s1_c0_p1; break;
                            case 2:  gauss_s1_x = gauss_s1_c0_p2; break;
                            case 3:  gauss_s1_x = gauss_s1_c0_p3; break;
                            case 4:  gauss_s1_x = gauss_s1_c0_p4; break;
                        };
                    } else if (i == 7) {
                        switch (gauss_index_k) {
                            case -4: gauss_s1_x = gauss_s1_c1_m4; break;
                            case -3: gauss_s1_x = gauss_s1_c1_m3; break;
                            case -2: gauss_s1_x = gauss_s1_c1_m2; break;
                            case -1: gauss_s1_x = gauss_s1_c1_m1; break;
                            case 0:  gauss_s1_x = gauss_s1_c1_z0; break;
                            case 1:  gauss_s1_x = gauss_s1_c1_p1; break;
                            case 2:  gauss_s1_x = gauss_s1_c1_p2; break;
                            case 3:  gauss_s1_x = gauss_s1_c1_p3; break;
                            case 4:  gauss_s1_x = gauss_s1_c1_p4; break;
                        };
                    }

/*
                    //Get the gaussian weighted x and y responses
                    float gauss_s1_x_real = expf(g1_factor * (xs_sub_sample_x_squared));
                    float gauss_s1_y_real = expf(g1_factor * (ys_sub_sample_y_squared));

                    if (gauss_s1_x != gauss_s1_x_real || gauss_s1_y != gauss_s1_y_real) {
                        std::cout << "gauss_s1_x: " << gauss_s1_x << std::endl;
                        std::cout << "gauss_s1_y: " << gauss_s1_y << std::endl;
                        std::cout << "gauss_s1_x_real: " << gauss_s1_x_real << std::endl;
                        std::cout << "gauss_s1_y_real: " << gauss_s1_y_real << std::endl;
                    }
*/

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = 0.0f;
                    float ry = 0.0f;
                    haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &rx, &ry);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            //float gauss_s2 = expf(g2_factor * (cx_squared + cy_squared)); 
            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            //float gauss_s2 = gauss_s2_precomputed[gauss_s2_index++];
            float gauss_s2;
            switch (gauss_s2_index) {
                case 0:  gauss_s2 = 0.026022f; break;
                case 1:  gauss_s2 = 0.040585f; break;
                case 2:  gauss_s2 = 0.040585f; break;
                case 3:  gauss_s2 = 0.026022f; break;
                case 4:  gauss_s2 = 0.040585f; break;
                case 5:  gauss_s2 = 0.063297f; break;
                case 6:  gauss_s2 = 0.063297f; break;
                case 7:  gauss_s2 = 0.040585f; break;
                case 8:  gauss_s2 = 0.040585f; break;
                case 9:  gauss_s2 = 0.063297f; break;
                case 10: gauss_s2 = 0.063297f; break;
                case 11: gauss_s2 = 0.040585f; break;
                case 12: gauss_s2 = 0.026022f; break;
                case 13: gauss_s2 = 0.040585f; break;
                case 14: gauss_s2 = 0.040585f; break;
                case 15: gauss_s2 = 0.026022f; break;
            };
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}